

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stub.c
# Opt level: O0

Solver * stub_solver_create(Solver *__return_storage_ptr__,Instance *instance,
                           SolverTypedParams *tparams,double timelimit,int32_t randomseed)

{
  Solver *solver;
  int32_t randomseed_local;
  double timelimit_local;
  SolverTypedParams *tparams_local;
  Instance *instance_local;
  
  memset(__return_storage_ptr__,0,0x28);
  __return_storage_ptr__->solve = solve;
  __return_storage_ptr__->destroy = destroy;
  return __return_storage_ptr__;
}

Assistant:

Solver stub_solver_create(const Instance *instance, SolverTypedParams *tparams,
                          double timelimit, int32_t randomseed) {
    UNUSED_PARAM(instance);
    UNUSED_PARAM(tparams);
    UNUSED_PARAM(timelimit);
    UNUSED_PARAM(randomseed);
    Solver solver = {0};
    solver.solve = solve;
    solver.destroy = destroy;
    return solver;
}